

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O2

char * __thiscall
cbtGImpactMeshShape::serialize(cbtGImpactMeshShape *this,void *dataBuffer,cbtSerializer *serializer)

{
  int iVar1;
  
  cbtCollisionShape::serialize((cbtCollisionShape *)this,dataBuffer,serializer);
  (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[0xe])
            (this->m_meshInterface,(long)dataBuffer + 0x10,serializer);
  *(undefined4 *)((long)dataBuffer + 0x40) =
       *(undefined4 *)
        &(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
         field_0x1c;
  cbtVector3::serializeFloat
            (&(this->super_cbtGImpactShapeInterface).localScaling,
             (cbtVector3FloatData *)((long)dataBuffer + 0x30));
  iVar1 = (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
            _vptr_cbtCollisionShape[0x14])(this);
  *(int *)((long)dataBuffer + 0x44) = iVar1;
  return "cbtGImpactMeshShapeData";
}

Assistant:

const char* cbtGImpactMeshShape::serialize(void* dataBuffer, cbtSerializer* serializer) const
{
	cbtGImpactMeshShapeData* trimeshData = (cbtGImpactMeshShapeData*)dataBuffer;

	cbtCollisionShape::serialize(&trimeshData->m_collisionShapeData, serializer);

	m_meshInterface->serialize(&trimeshData->m_meshInterface, serializer);

	trimeshData->m_collisionMargin = float(m_collisionMargin);

	localScaling.serializeFloat(trimeshData->m_localScaling);

	trimeshData->m_gimpactSubType = int(getGImpactShapeType());

	return "cbtGImpactMeshShapeData";
}